

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

void __thiscall
pica::Grid<(pica::Dimension)2,_double>::Grid
          (Grid<(pica::Dimension)2,_double> *this,PositionType *origin,PositionType *step,
          IndexType *size)

{
  IndexType size_00;
  IndexType size_01;
  IndexType size_02;
  IndexType size_03;
  IndexType size_04;
  IndexType size_05;
  IndexType size_06;
  IndexType size_07;
  IndexType size_08;
  double dVar1;
  
  size_00.x = size->x;
  size_00.y = size->y;
  Array2d<double>::Array2d(&this->exData,size_00,0.0);
  size_01.x = size->x;
  size_01.y = size->y;
  Array2d<double>::Array2d(&this->eyData,size_01,0.0);
  size_02.x = size->x;
  size_02.y = size->y;
  Array2d<double>::Array2d(&this->ezData,size_02,0.0);
  size_03.x = size->x;
  size_03.y = size->y;
  Array2d<double>::Array2d(&this->bxData,size_03,0.0);
  size_04.x = size->x;
  size_04.y = size->y;
  Array2d<double>::Array2d(&this->byData,size_04,0.0);
  size_05.x = size->x;
  size_05.y = size->y;
  Array2d<double>::Array2d(&this->bzData,size_05,0.0);
  size_06.x = size->x;
  size_06.y = size->y;
  Array2d<double>::Array2d(&this->jxData,size_06,0.0);
  size_07.x = size->x;
  size_07.y = size->y;
  Array2d<double>::Array2d(&this->jyData,size_07,0.0);
  size_08.x = size->x;
  size_08.y = size->y;
  Array2d<double>::Array2d(&this->jzData,size_08,0.0);
  dVar1 = origin->y;
  (this->origin).x = origin->x;
  (this->origin).y = dVar1;
  dVar1 = step->y;
  (this->step).x = step->x;
  (this->step).y = dVar1;
  return;
}

Assistant:

Grid(const PositionType& origin, const PositionType& step, const IndexType& size) :
        exData(size),
        eyData(size),
        ezData(size),
        bxData(size),
        byData(size),
        bzData(size),
        jxData(size),
        jyData(size),
        jzData(size),
        origin(origin),
        step(step) {}